

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::ForNode(CConnman *this,NodeId id,function<bool_(CNode_*)> func)

{
  CNode *pCVar1;
  undefined1 uVar2;
  CNode **pnode;
  pointer ppCVar3;
  undefined8 uVar4;
  long in_RDX;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppCVar3 ==
        (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_008c7fbd:
      uVar2 = 0;
LAB_008c7fbf:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return (bool)uVar2;
      }
LAB_008c8041:
      __stack_chk_fail();
    }
    pCVar1 = *ppCVar3;
    if (pCVar1->id == id) {
      if ((((pCVar1->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
         (((pCVar1->fDisconnect)._M_base._M_i & 1U) == 0)) {
        if (*(long *)(in_RDX + 0x10) != 0) {
          uVar2 = (**(code **)(in_RDX + 0x18))();
          goto LAB_008c7fbf;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = std::__throw_bad_function_call();
          std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            _Unwind_Resume(uVar4);
          }
        }
        goto LAB_008c8041;
      }
      goto LAB_008c7fbd;
    }
    ppCVar3 = ppCVar3 + 1;
  } while( true );
}

Assistant:

bool CConnman::ForNode(NodeId id, std::function<bool(CNode* pnode)> func)
{
    CNode* found = nullptr;
    LOCK(m_nodes_mutex);
    for (auto&& pnode : m_nodes) {
        if(pnode->GetId() == id) {
            found = pnode;
            break;
        }
    }
    return found != nullptr && NodeFullyConnected(found) && func(found);
}